

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImDrawList::ImDrawList(ImDrawList *this,ImDrawListSharedData *shared_data)

{
  (this->_Splitter)._Channels.Size = 0;
  (this->_Splitter)._Channels.Capacity = 0;
  (this->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
  (this->CmdBuffer).Size = 0;
  (this->CmdBuffer).Capacity = 0;
  (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  (this->IdxBuffer).Size = 0;
  (this->IdxBuffer).Capacity = 0;
  (this->IdxBuffer).Data = (unsigned_short *)0x0;
  (this->VtxBuffer).Size = 0;
  (this->VtxBuffer).Capacity = 0;
  (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  (this->_ClipRectStack).Size = 0;
  (this->_ClipRectStack).Capacity = 0;
  (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  (this->_TextureIdStack).Size = 0;
  (this->_TextureIdStack).Capacity = 0;
  (this->_TextureIdStack).Data = (void **)0x0;
  (this->_Path).Size = 0;
  (this->_Path).Capacity = 0;
  (this->_Path).Data = (ImVec2 *)0x0;
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  this->_Data = shared_data;
  this->_OwnerName = (char *)0x0;
  Clear(this);
  return;
}

Assistant:

ImDrawList(const ImDrawListSharedData* shared_data) { _Data = shared_data; _OwnerName = NULL; Clear(); }